

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O1

bool EV_MovePolyTo(line_t *line,int polyNum,double speed,DVector2 *targ,bool overRide)

{
  FPolyObj *pFVar1;
  DPolyAction *pDVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  FPolyMirrorIterator it;
  double local_228;
  double local_218;
  FPolyMirrorIterator local_1d0;
  
  lVar3 = (long)po_NumPolyobjs;
  local_1d0.CurPoly = polyobjs;
  if (0 < lVar3) {
    do {
      if ((local_1d0.CurPoly)->tag == polyNum) goto LAB_0055fffa;
      lVar3 = lVar3 + -1;
      local_1d0.CurPoly = local_1d0.CurPoly + 1;
    } while (lVar3 != 0);
  }
  local_1d0.CurPoly = (FPolyObj *)0x0;
LAB_0055fffa:
  if (local_1d0.CurPoly == (FPolyObj *)0x0) {
    bVar5 = false;
    Printf("EV_MovePolyTo: Invalid polyobj num: %d\n");
  }
  else {
    local_1d0.UsedPolys[0] = (local_1d0.CurPoly)->tag;
    local_1d0.NumUsedPolys = 1;
    local_218 = targ->X - ((local_1d0.CurPoly)->StartSpot).pos.X;
    local_228 = targ->Y - ((local_1d0.CurPoly)->StartSpot).pos.Y;
    dVar6 = c_sqrt(local_228 * local_228 + local_218 * local_218);
    pFVar1 = FPolyMirrorIterator::NextMirror(&local_1d0);
    if (pFVar1 == (FPolyObj *)0x0) {
      bVar5 = false;
    }
    else {
      dVar7 = (double)(~-(ulong)(dVar6 != 0.0) & (ulong)dVar6 |
                      (ulong)(1.0 / dVar6) & -(ulong)(dVar6 != 0.0));
      local_228 = local_228 * dVar7;
      local_218 = local_218 * dVar7;
      bVar4 = false;
      do {
        pDVar2 = (pFVar1->specialdata).field_0.p;
        if (pDVar2 == (DPolyAction *)0x0) {
LAB_005600f2:
          if (pFVar1->bBlocked == true && !overRide) {
            return bVar4;
          }
        }
        else {
          if (((pDVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
            (pFVar1->specialdata).field_0.p = (DPolyAction *)0x0;
            goto LAB_005600f2;
          }
          if (!overRide) {
            return bVar4;
          }
        }
        pDVar2 = (DPolyAction *)
                 M_Malloc_Dbg(0x78,
                              "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobject.h"
                              ,0x1f7);
        DPolyAction::DPolyAction(pDVar2,pFVar1->tag);
        (pDVar2->super_DThinker).super_DObject._vptr_DObject =
             (_func_int **)&PTR_StaticType_0084c0b8;
        pDVar2[1].super_DThinker.super_DObject._vptr_DObject = (_func_int **)0x0;
        pDVar2[1].super_DThinker.super_DObject.Class = (PClass *)0x0;
        pDVar2[1].super_DThinker.super_DObject.ObjNext = (DObject *)0x0;
        pDVar2[1].super_DThinker.super_DObject.GCNext = (DObject *)0x0;
        (pFVar1->specialdata).field_0.p = pDVar2;
        pFVar1->bBlocked = false;
        pDVar2->m_Dist = dVar6;
        pDVar2->m_Speed = speed;
        pDVar2[1].super_DThinker.super_DObject.Class = (PClass *)(local_228 * speed);
        pDVar2[1].super_DThinker.super_DObject._vptr_DObject = (_func_int **)(local_218 * speed);
        dVar7 = (pFVar1->StartSpot).pos.X;
        pDVar2[1].super_DThinker.super_DObject.GCNext =
             (DObject *)(dVar6 * local_228 + (pFVar1->StartSpot).pos.Y);
        pDVar2[1].super_DThinker.super_DObject.ObjNext = (DObject *)(dVar6 * local_218 + dVar7);
        if (dVar6 / speed <= 2.0) {
          DPolyAction::StopInterpolation(pDVar2);
        }
        local_218 = -local_218;
        local_228 = -local_228;
        pFVar1 = FPolyMirrorIterator::NextMirror(&local_1d0);
        bVar4 = true;
        bVar5 = true;
      } while (pFVar1 != (FPolyObj *)0x0);
    }
  }
  return bVar5;
}

Assistant:

bool EV_MovePolyTo(line_t *line, int polyNum, double speed, const DVector2 &targ, bool overRide)
{
	DMovePolyTo *pe = NULL;
	FPolyObj *poly;
	DVector2 dist;
	double distlen;

	if ((poly = PO_GetPolyobj(polyNum)) == NULL)
	{
		Printf("EV_MovePolyTo: Invalid polyobj num: %d\n", polyNum);
		return false;
	}
	FPolyMirrorIterator it(poly);

	dist = targ - poly->StartSpot.pos;
	distlen = dist.MakeUnit();
	while ((poly = it.NextMirror()) != NULL)
	{
		if ((poly->specialdata != NULL || poly->bBlocked) && !overRide)
		{ // poly is already in motion
			break;
		}
		pe = new DMovePolyTo(poly->tag);
		poly->specialdata = pe;
		poly->bBlocked = false;
		pe->m_Dist = distlen;
		pe->m_Speed = speed;
		pe->m_Speedv = dist * speed;
		pe->m_Target = poly->StartSpot.pos + dist * distlen;
		if ((pe->m_Dist / pe->m_Speed) <= 2)
		{
			pe->StopInterpolation();
		}
		dist = -dist;	// reverse the direction
	}
	return pe != NULL; // Return true if something started moving.
}